

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  ImRect unclipped_rect;
  ImRect local_48;
  float local_38;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if (pIVar1->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (pIVar1->ClipRect).Min;
    local_48.Max = (pIVar1->ClipRect).Max;
    if (GImGui->NavMoveRequest == true) {
      local_38 = items_height;
      ImRect::Add(&local_48,&GImGui->NavScoringRect);
      items_height = local_38;
    }
    if ((pIVar2->NavJustMovedToId != 0) && (pIVar1->NavLastIds[0] == pIVar2->NavJustMovedToId)) {
      fVar10 = (pIVar1->Pos).y;
      fVar7 = pIVar1->NavRectRel[0].Min.y + fVar10;
      fVar10 = fVar10 + pIVar1->NavRectRel[0].Max.y;
      if (fVar7 < local_48.Min.y) {
        local_48.Min.y = fVar7;
      }
      if (local_48.Max.y < fVar10) {
        local_48.Max.y = fVar10;
      }
    }
    fVar10 = (pIVar1->DC).CursorPos.y;
    auVar8._0_4_ = local_48.Max.y - fVar10;
    auVar8._4_4_ = local_48.Min.y - fVar10;
    auVar8._8_4_ = local_48.Max.y - fVar10;
    auVar8._12_4_ = local_48.Max.y - fVar10;
    auVar9._4_4_ = items_height;
    auVar9._0_4_ = items_height;
    auVar9._8_4_ = items_height;
    auVar9._12_4_ = items_height;
    auVar9 = divps(auVar8,auVar9);
    iVar5 = (int)auVar9._0_4_;
    iVar6 = (int)auVar9._4_4_;
    if (pIVar2->NavMoveRequest == true) {
      iVar5 = iVar5 - ((int)-(uint)(pIVar2->NavMoveClipDir == 3) >> 0x1f);
      iVar6 = iVar6 - (uint)(pIVar2->NavMoveClipDir == 2);
    }
    iVar3 = items_count;
    if (iVar6 < items_count) {
      iVar3 = iVar6;
    }
    iVar4 = 0;
    if (-1 < iVar6) {
      iVar4 = iVar3;
    }
    iVar5 = iVar5 + 1;
    if (iVar5 < items_count) {
      items_count = iVar5;
    }
    if (iVar5 < iVar4) {
      items_count = iVar4;
    }
    *out_items_display_start = iVar4;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}